

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O1

DAngle __thiscall DBot::FireRox(DBot *this,AActor *enemy,ticcmd_t *cmd)

{
  uint uVar1;
  _func_int **pp_Var2;
  AActor *thing;
  TObjPtr<AActor> t1;
  bool bVar3;
  int iVar4;
  PClass *pPVar5;
  ticcmd_t *in_RCX;
  double dVar6;
  double extraout_XMM0_Qa;
  DAngle DVar7;
  FCheckPosition tm;
  FCheckPosition local_d8;
  DVector2 local_40;
  
  pp_Var2 = (enemy->snext->super_DThinker).super_DObject._vptr_DObject;
  local_d8.pos.Y = (double)pp_Var2[0x30] * 0.5 + (double)pp_Var2[0xb];
  local_d8.thing = (AActor *)((double)pp_Var2[0x19] * 5.0 + (double)pp_Var2[9]);
  local_d8.pos.X = (double)pp_Var2[0x1a] * 5.0 + (double)pp_Var2[10];
  FCajunMaster::SetBodyAt(&bglobal,(DVector3 *)&local_d8,2);
  if ((bglobal.body2.field_0 != (AActor *)0x0) &&
     ((*(byte *)((long)bglobal.body2.field_0 + 0x20) & 0x20) != 0)) {
    bglobal.body2.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  }
  t1.field_0 = bglobal.body2.field_0;
  dVar6 = AActor::Distance2D((AActor *)bglobal.body2.field_0,(AActor *)cmd,false);
  if (140.0 <= dVar6) {
    iVar4 = FName::NameManager::FindName(&FName::NameData,"Rocket",true);
    local_d8.thing = (AActor *)CONCAT44(local_d8.thing._4_4_,iVar4);
    pPVar5 = PClass::FindClass((FName *)&local_d8);
    dVar6 = (dVar6 + 1.0) / *(double *)(pPVar5->Defaults + 0xe0) + 2.0;
    local_d8.thing = (AActor *)(*(double *)&cmd[10].ucmd * dVar6 + *(double *)&cmd[3].ucmd.sidemove)
    ;
    local_d8.pos.X = dVar6 * *(double *)&cmd[10].ucmd.roll + *(double *)&cmd[4].ucmd;
    local_d8.pos.Y = -2147483648.0;
    FCajunMaster::SetBodyAt(&bglobal,(DVector3 *)&local_d8,1);
    if ((bglobal.body1.field_0 != (AActor *)0x0) &&
       ((*(byte *)((long)bglobal.body1.field_0 + 0x20) & 0x20) != 0)) {
      bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
    }
    bVar3 = P_CheckSight((AActor *)t1.field_0,(AActor *)bglobal.body1.field_0,1);
    if (bVar3) {
      local_d8.LastRipped._16_8_ = local_d8.LastRipped._16_8_ & 0xffffffff;
      TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
                (&local_d8.LastRipped,1);
      local_d8.DoRipping = false;
      local_d8.PushTime = 0;
      local_d8.FromPMove = false;
      thing = (AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject;
      local_40.X = *(double *)((long)t1.field_0 + 0x48);
      local_40.Y = *(double *)((long)t1.field_0 + 0x50);
      uVar1 = (thing->flags).Value;
      (thing->flags).Value = uVar1 & 0xfffff7ff;
      bVar3 = P_CheckPosition(thing,&local_40,&local_d8,false);
      (thing->flags).Value = uVar1;
      if (bVar3) {
        if ((bglobal.body1.field_0 != (AActor *)0x0) &&
           ((*(byte *)((long)bglobal.body1.field_0 + 0x20) & 0x20) != 0)) {
          bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
        }
        dVar6 = FCajunMaster::FakeFire
                          (&bglobal,(AActor *)t1.field_0,(AActor *)bglobal.body1.field_0,in_RCX);
        if (140.0 <= dVar6) {
          if ((bglobal.body1.field_0 != (AActor *)0x0) &&
             ((*(byte *)((long)bglobal.body1.field_0 + 0x20) & 0x20) != 0)) {
            bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
          }
          AActor::AngleTo((AActor *)this,(AActor *)t1.field_0,bglobal.body1.field_0._0_1_);
          M_Free(local_d8.LastRipped.Nodes);
          return (DAngle)0.0;
        }
      }
      M_Free(local_d8.LastRipped.Nodes);
      local_d8.LastRipped.Nodes = (Node *)0x0;
      local_d8.LastRipped.LastFree = (Node *)0x0;
      local_d8.LastRipped.Size = 0;
      local_d8.LastRipped.NumUsed = 0;
    }
    bVar3 = P_CheckSight((AActor *)t1.field_0,(AActor *)cmd,0);
    dVar6 = extraout_XMM0_Qa;
    if ((bVar3) &&
       (dVar6 = FCajunMaster::FakeFire
                          (&bglobal,(AActor *)
                                    (enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                           (AActor *)cmd,in_RCX), 140.0 <= dVar6)) {
      DVar7 = AActor::AngleTo((AActor *)this,
                              (AActor *)(enemy->snext->super_DThinker).super_DObject._vptr_DObject,
                              SUB81(cmd,0));
      return (DAngle)DVar7.Degrees;
    }
  }
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)0x0;
  return (DAngle)dVar6;
}

Assistant:

DAngle DBot::FireRox (AActor *enemy, ticcmd_t *cmd)
{
	double dist;
	AActor *actor;
	double m;

	bglobal.SetBodyAt(player->mo->PosPlusZ(player->mo->Height / 2) + player->mo->Vel.XY() * 5, 2);

	actor = bglobal.body2;

	dist = actor->Distance2D (enemy);
	if (dist < SAFE_SELF_MISDIST)
		return 0.;
	//Predict.
	m = ((dist+1) / GetDefaultByName("Rocket")->Speed);

	bglobal.SetBodyAt(DVector3((enemy->Pos() + enemy->Vel * (m + 2)), ONFLOORZ), 1);
	
	//try the predicted location
	if (P_CheckSight (actor, bglobal.body1, SF_IGNOREVISIBILITY)) //See the predicted location, so give a test missile
	{
		FCheckPosition tm;
		if (bglobal.SafeCheckPosition (player->mo, actor->X(), actor->Y(), tm))
		{
			if (bglobal.FakeFire (actor, bglobal.body1, cmd) >= SAFE_SELF_MISDIST)
			{
				return actor->AngleTo(bglobal.body1);
			}
		}
	}
	//Try fire straight.
	if (P_CheckSight (actor, enemy, 0))
	{
		if (bglobal.FakeFire (player->mo, enemy, cmd) >= SAFE_SELF_MISDIST)
		{
			return player->mo->AngleTo(enemy);
		}
	}
	return 0.;
}